

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateMessageFile
               (FileDescriptor *file,Descriptor *message,bool is_descriptor,
               GeneratorContext *generator_context)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined1 is_descriptor_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  int i;
  int i_3;
  uint is_descriptor_01;
  long lVar4;
  string metadata_filename;
  string fullname;
  string local_130;
  Printer printer;
  string metadata_fullname;
  string filename;
  ZeroCopyOutputStream *output;
  
  if (*(char *)(*(long *)(message + 0x20) + 0x4b) == '\0') {
    is_descriptor_01 = (uint)is_descriptor;
    GeneratedClassFileName<google::protobuf::Descriptor>(&filename,message,is_descriptor);
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&filename);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
    io::Printer::Printer(&printer,output,'^');
    GenerateHead(file,&printer);
    FilenameToClassname(&fullname,&filename);
    lVar3 = std::__cxx11::string::find_last_of((char *)&fullname,0x38d6ed);
    if (lVar3 << 0x20 != -0x100000000) {
      std::__cxx11::string::substr((ulong)&metadata_filename,(ulong)&fullname);
      io::Printer::Print<char[5],std::__cxx11::string>
                (&printer,"namespace ^name^;\n\n",(char (*) [5])0x38d8c6,&metadata_filename);
      std::__cxx11::string::~string((string *)&metadata_filename);
    }
    GenerateUseDeclaration(is_descriptor,&printer);
    GenerateMessageDocComment(&printer,message,is_descriptor_01);
    if (lVar3 << 0x20 != -0x100000000) {
      std::__cxx11::string::substr((ulong)&metadata_filename,(ulong)&fullname);
      std::__cxx11::string::operator=((string *)&fullname,(string *)&metadata_filename);
      std::__cxx11::string::~string((string *)&metadata_filename);
    }
    args_1 = &fullname;
    io::Printer::Print<char[5],std::__cxx11::string>
              (&printer,"class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n{\n",
               (char (*) [5])0x38d8c6,args_1);
    Indent(&printer);
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < *(int *)(message + 0x68); lVar3 = lVar3 + 1) {
      GenerateField((FieldDescriptor *)(*(long *)(message + 0x28) + lVar4),&printer,is_descriptor);
      lVar4 = lVar4 + 0x98;
    }
    lVar4 = 0;
    for (lVar3 = 0; is_descriptor_00 = SUB81(args_1,0), lVar3 < *(int *)(message + 0x6c);
        lVar3 = lVar3 + 1) {
      GenerateOneofField((OneofDescriptor *)(*(long *)(message + 0x30) + lVar4),&printer);
      lVar4 = lVar4 + 0x30;
    }
    io::Printer::Print<>(&printer,"\n");
    GenerateMessageConstructorDocComment(&printer,message,is_descriptor_01);
    io::Printer::Print<>(&printer,"public function __construct($data = NULL) {\n");
    Indent(&printer);
    GeneratedMetadataFileName_abi_cxx11_
              (&metadata_filename,(php *)file,(FileDescriptor *)(ulong)is_descriptor_01,
               (bool)is_descriptor_00);
    FilenameToClassname(&metadata_fullname,&metadata_filename);
    io::Printer::Print<char[9],std::__cxx11::string>
              (&printer,"\\^fullname^::initOnce();\nparent::__construct($data);\n",
               (char (*) [9])"fullname",&metadata_fullname);
    Outdent(&printer);
    io::Printer::Print<>(&printer,"}\n\n");
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < *(int *)(message + 0x68); lVar3 = lVar3 + 1) {
      GenerateFieldAccessor
                ((FieldDescriptor *)(*(long *)(message + 0x28) + lVar4),is_descriptor,&printer);
      lVar4 = lVar4 + 0x98;
    }
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < *(int *)(message + 0x6c); lVar3 = lVar3 + 1) {
      lVar1 = *(long *)(message + 0x30);
      UnderscoresToCamelCase(&local_130,*(string **)(lVar1 + lVar4),true);
      io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
                (&printer,
                 "/**\n * @return string\n */\npublic function get^camel_name^()\n{\n    return $this->whichOneof(\"^name^\");\n}\n\n"
                 ,(char (*) [11])"camel_name",&local_130,(char (*) [5])0x38d8c6,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar1 + lVar4));
      std::__cxx11::string::~string((string *)&local_130);
      lVar4 = lVar4 + 0x30;
    }
    Outdent(&printer);
    io::Printer::Print<>(&printer,"}\n\n");
    if (*(long *)(message + 0x18) != 0) {
      io::Printer::Print<>
                (&printer,
                 "// Adding a class alias for backwards compatibility with the previous class name.\n"
                );
      LegacyFullClassName<google::protobuf::Descriptor>(&local_130,message,is_descriptor);
      io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
                (&printer,"class_alias(^new^::class, \\^old^::class);\n\n",(char (*) [4])"new",
                 &fullname,(char (*) [4])"old",&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      LegacyGenerateClassFile<google::protobuf::Descriptor>
                (file,message,is_descriptor,generator_context);
    }
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < *(int *)(message + 0x70); lVar4 = lVar4 + 1) {
      GenerateMessageFile(file,(Descriptor *)(*(long *)(message + 0x38) + lVar3),is_descriptor,
                          generator_context);
      lVar3 = lVar3 + 0x90;
    }
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < *(int *)(message + 0x74); lVar4 = lVar4 + 1) {
      GenerateEnumFile(file,(EnumDescriptor *)(*(long *)(message + 0x40) + lVar3),is_descriptor,
                       generator_context);
      lVar3 = lVar3 + 0x50;
    }
    std::__cxx11::string::~string((string *)&metadata_fullname);
    std::__cxx11::string::~string((string *)&metadata_filename);
    std::__cxx11::string::~string((string *)&fullname);
    io::Printer::~Printer(&printer);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])();
    }
    std::__cxx11::string::~string((string *)&filename);
  }
  return;
}

Assistant:

void GenerateMessageFile(const FileDescriptor* file, const Descriptor* message,
                         bool is_descriptor,
                         GeneratorContext* generator_context) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }

  std::string filename = GeneratedClassFileName(message, is_descriptor);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateUseDeclaration(is_descriptor, &printer);

  GenerateMessageDocComment(&printer, message, is_descriptor);
  if (lastindex != string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  printer.Print(
      "class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n"
      "{\n",
      "name", fullname);
  Indent(&printer);

  // Field and oneof definitions.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateField(field, &printer, is_descriptor);
  }
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    GenerateOneofField(oneof, &printer);
  }
  printer.Print("\n");

  GenerateMessageConstructorDocComment(&printer, message, is_descriptor);
  printer.Print(
      "public function __construct($data = NULL) {\n");
  Indent(&printer);

  std::string metadata_filename =
      GeneratedMetadataFileName(file, is_descriptor);
  std::string metadata_fullname = FilenameToClassname(metadata_filename);
  printer.Print(
      "\\^fullname^::initOnce();\n"
      "parent::__construct($data);\n",
      "fullname", metadata_fullname);

  Outdent(&printer);
  printer.Print("}\n\n");

  // Field and oneof accessors.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateFieldAccessor(field, is_descriptor, &printer);
  }
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer.Print(
      "/**\n"
      " * @return string\n"
      " */\n"
      "public function get^camel_name^()\n"
      "{\n"
      "    return $this->whichOneof(\"^name^\");\n"
      "}\n\n",
      "camel_name", UnderscoresToCamelCase(oneof->name(), true), "name",
      oneof->name());
  }

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatiblity with nested messages and enums
  if (message->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(message, is_descriptor));
    LegacyGenerateClassFile(file, message, is_descriptor, generator_context);
  }

  // Nested messages and enums.
  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageFile(file, message->nested_type(i), is_descriptor,
                        generator_context);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumFile(file, message->enum_type(i), is_descriptor,
                     generator_context);
  }
}